

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

void __thiscall
Js::JavascriptStackWalker::WalkAndClearInlineeFrameCallInfoOnException
          (JavascriptStackWalker *this,void *tryHandlerAddrOfReturnAddr)

{
  ScriptContext *scriptContext;
  bool bVar1;
  BOOL BVar2;
  void *pvVar3;
  InlinedFrame *this_00;
  InlinedFrame *inlinedFrame;
  int index;
  void *tryHandlerAddrOfReturnAddr_local;
  JavascriptStackWalker *this_local;
  
  do {
    BVar2 = Walk(this,true);
    if (BVar2 == 0) {
      return;
    }
    scriptContext = this->scriptContext;
    pvVar3 = Amd64StackFrame::GetInstructionPointer(&this->currentFrame);
    BVar2 = JavascriptFunction::IsNativeAddress(scriptContext,pvVar3);
    if ((BVar2 != 0) && (bVar1 = HasInlinedFramesOnStack(this), bVar1)) {
      inlinedFrame._4_4_ = InlinedFrameWalker::GetFrameCount(&this->inlinedFrameWalker);
      while (inlinedFrame._4_4_ = inlinedFrame._4_4_ + -1, -1 < inlinedFrame._4_4_) {
        this_00 = InlinedFrameWalker::GetFrameAtIndex(&this->inlinedFrameWalker,inlinedFrame._4_4_);
        InlineeCallInfo::Clear((InlineeCallInfo *)this_00);
      }
    }
    pvVar3 = Amd64StackFrame::GetAddressOfReturnAddress(&this->currentFrame,false,true);
  } while (pvVar3 != tryHandlerAddrOfReturnAddr);
  return;
}

Assistant:

void JavascriptStackWalker::WalkAndClearInlineeFrameCallInfoOnException(void *tryHandlerAddrOfReturnAddr)
    {
        // Walk the stack and when we find the first native frame, we clear the inlinee's callinfo for this frame
        // It is sufficient we stop at the first native frame which had the enclosing try-catch
        // TODO : Revisit when we start inlining functions with try-catch/try-finally
        while (this->Walk(true))
        {
            if (JavascriptFunction::IsNativeAddress(this->scriptContext, this->currentFrame.GetInstructionPointer()))
            {
                if (HasInlinedFramesOnStack())
                {
                    for (int index = inlinedFrameWalker.GetFrameCount() - 1; index >= 0; index--)
                    {
                        auto inlinedFrame = inlinedFrameWalker.GetFrameAtIndex(index);
                        inlinedFrame->callInfo.Clear();
                    }
                }
            }
            if (this->currentFrame.GetAddressOfReturnAddress() == tryHandlerAddrOfReturnAddr)
            {
                break;
            }
        }
    }